

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O0

iff_chunk * __thiscall iff_chunk::find_sub_chunk(iff_chunk *this,char *p_id,uint index)

{
  size_type sVar1;
  const_reference pvVar2;
  ulong local_30;
  size_t i;
  uint index_local;
  char *p_id_local;
  iff_chunk *this_local;
  
  local_30 = 0;
  i._4_4_ = index;
  do {
    sVar1 = std::vector<iff_chunk,_std::allocator<iff_chunk>_>::size(&this->m_sub_chunks);
    if (sVar1 <= local_30) {
      return this;
    }
    pvVar2 = std::vector<iff_chunk,_std::allocator<iff_chunk>_>::operator[]
                       (&this->m_sub_chunks,local_30);
    if (*(int *)p_id == *(int *)pvVar2->m_id) {
      if (i._4_4_ != 0) {
        i._4_4_ = i._4_4_ - 1;
      }
      if (i._4_4_ == 0) {
        pvVar2 = std::vector<iff_chunk,_std::allocator<iff_chunk>_>::operator[]
                           (&this->m_sub_chunks,local_30);
        return pvVar2;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

const iff_chunk & find_sub_chunk( const char * p_id, unsigned index = 0 ) const
    {
        for ( std::size_t i = 0; i < m_sub_chunks.size(); ++i )
        {
            if ( !memcmp( p_id, m_sub_chunks[ i ].m_id, 4 ) )
            {
                if ( index ) --index;
                if ( !index ) return m_sub_chunks[ i ];
            }
        }
        /*throw exception_io_data( pfc::string_formatter() << "Missing IFF chunk: " << p_id );*/
        return *this;
    }